

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int side1_7d_filter(double *p0,double *p1,double *q0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  dVar17 = *p0;
  dVar23 = p0[1];
  dVar14 = dVar17 - *p1;
  dVar10 = dVar23 - p1[1];
  dVar1 = p0[2];
  dVar20 = dVar1 - p1[2];
  dVar2 = p0[3];
  dVar11 = dVar2 - p1[3];
  dVar3 = p0[4];
  dVar12 = dVar3 - p1[4];
  dVar25 = *p1 - dVar17;
  dVar8 = p1[1] - dVar23;
  dVar26 = p1[2] - dVar1;
  dVar15 = p1[3] - dVar2;
  dVar13 = p1[4] - dVar3;
  dVar4 = p0[5];
  dVar24 = dVar4 - p1[5];
  dVar16 = p1[5] - dVar4;
  dVar5 = p0[6];
  dVar21 = dVar5 - p1[6];
  dVar9 = p1[6] - dVar5;
  dVar7 = ABS(dVar10);
  if (ABS(dVar10) <= ABS(dVar14)) {
    dVar7 = ABS(dVar14);
  }
  dVar18 = ABS(dVar20);
  if (ABS(dVar20) <= dVar7) {
    dVar18 = dVar7;
  }
  dVar7 = ABS(dVar11);
  if (ABS(dVar11) <= dVar18) {
    dVar7 = dVar18;
  }
  dVar18 = ABS(dVar12);
  if (ABS(dVar12) <= dVar7) {
    dVar18 = dVar7;
  }
  dVar7 = ABS(dVar24);
  if (ABS(dVar24) <= dVar18) {
    dVar7 = dVar18;
  }
  dVar18 = ABS(dVar21);
  if (ABS(dVar21) <= dVar7) {
    dVar18 = dVar7;
  }
  dVar7 = ABS(dVar25);
  if (dVar7 <= dVar18) {
    dVar7 = dVar18;
  }
  dVar22 = ABS(dVar8);
  if (dVar22 <= dVar7) {
    dVar22 = dVar7;
  }
  dVar7 = ABS(dVar26);
  if (dVar7 <= dVar22) {
    dVar7 = dVar22;
  }
  dVar22 = ABS(dVar15);
  if (dVar22 <= dVar7) {
    dVar22 = dVar7;
  }
  dVar7 = ABS(dVar13);
  if (dVar7 <= dVar22) {
    dVar7 = dVar22;
  }
  dVar22 = ABS(dVar16);
  if (dVar22 <= dVar7) {
    dVar22 = dVar7;
  }
  dVar7 = ABS(dVar9);
  if (dVar7 <= dVar22) {
    dVar7 = dVar22;
  }
  dVar22 = ABS(*q0 - dVar17);
  if (dVar22 <= dVar18) {
    dVar22 = dVar18;
  }
  dVar18 = ABS(q0[1] - dVar23);
  if (dVar18 <= dVar22) {
    dVar18 = dVar22;
  }
  dVar22 = ABS(q0[2] - dVar1);
  if (dVar22 <= dVar18) {
    dVar22 = dVar18;
  }
  dVar18 = ABS(q0[3] - dVar2);
  if (dVar18 <= dVar22) {
    dVar18 = dVar22;
  }
  dVar22 = ABS(q0[4] - dVar3);
  if (dVar22 <= dVar18) {
    dVar22 = dVar18;
  }
  dVar18 = ABS(q0[5] - dVar4);
  if (dVar18 <= dVar22) {
    dVar18 = dVar22;
  }
  dVar22 = ABS(q0[6] - dVar5);
  if (dVar22 <= dVar18) {
    dVar22 = dVar18;
  }
  dVar18 = dVar7;
  dVar19 = dVar22;
  if ((dVar7 <= dVar22) && (dVar19 = dVar7, dVar7 < dVar22)) {
    dVar18 = dVar22;
  }
  iVar6 = 0;
  if ((1.2708086158026695e-147 <= dVar19) && (iVar6 = 0, dVar18 <= 5.599361855444509e+101)) {
    dVar17 = dVar9 * (q0[6] - dVar5) +
             dVar16 * (q0[5] - dVar4) +
             dVar13 * (q0[4] - dVar3) +
             dVar15 * (q0[3] - dVar2) +
             dVar26 * (q0[2] - dVar1) + dVar25 * (*q0 - dVar17) + dVar8 * (q0[1] - dVar23);
    dVar23 = dVar7 * dVar22 * 1.3777934958250494e-14;
    dVar17 = (dVar21 * dVar21 +
             dVar24 * dVar24 +
             dVar12 * dVar12 + dVar11 * dVar11 + dVar20 * dVar20 + dVar14 * dVar14 + dVar10 * dVar10
             ) - (dVar17 + dVar17);
    iVar6 = 1;
    if ((dVar17 <= dVar23) && (iVar6 = 0, dVar17 < -dVar23)) {
      iVar6 = -1;
    }
  }
  return iVar6;
}

Assistant:

inline int side1_7d_filter( const double* p0, const double* p1, const double* q0) {
    double p0_0_p1_0 = (p0[0] - p1[0]);
    double p0_1_p1_1 = (p0[1] - p1[1]);
    double p0_2_p1_2 = (p0[2] - p1[2]);
    double p0_3_p1_3 = (p0[3] - p1[3]);
    double p0_4_p1_4 = (p0[4] - p1[4]);
    double p0_5_p1_5 = (p0[5] - p1[5]);
    double p0_6_p1_6 = (p0[6] - p1[6]);
    double r;
    r = (1 * (((((((p0_0_p1_0 * p0_0_p1_0) + (p0_1_p1_1 * p0_1_p1_1)) + (p0_2_p1_2 * p0_2_p1_2)) + (p0_3_p1_3 * p0_3_p1_3)) + (p0_4_p1_4 * p0_4_p1_4)) + (p0_5_p1_5 * p0_5_p1_5)) + (p0_6_p1_6 * p0_6_p1_6)));
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    r = (r - (2 * (((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0_0_p1_0);
    if( (max1 < fabs(p0_1_p1_1)) )
    {
        max1 = fabs(p0_1_p1_1);
    } 
    if( (max1 < fabs(p0_2_p1_2)) )
    {
        max1 = fabs(p0_2_p1_2);
    } 
    if( (max1 < fabs(p0_3_p1_3)) )
    {
        max1 = fabs(p0_3_p1_3);
    } 
    if( (max1 < fabs(p0_4_p1_4)) )
    {
        max1 = fabs(p0_4_p1_4);
    } 
    if( (max1 < fabs(p0_5_p1_5)) )
    {
        max1 = fabs(p0_5_p1_5);
    } 
    if( (max1 < fabs(p0_6_p1_6)) )
    {
        max1 = fabs(p0_6_p1_6);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    double max2 = fabs(p0_0_p1_0);
    if( (max2 < fabs(p0_1_p1_1)) )
    {
        max2 = fabs(p0_1_p1_1);
    } 
    if( (max2 < fabs(p0_2_p1_2)) )
    {
        max2 = fabs(p0_2_p1_2);
    } 
    if( (max2 < fabs(p0_3_p1_3)) )
    {
        max2 = fabs(p0_3_p1_3);
    } 
    if( (max2 < fabs(p0_4_p1_4)) )
    {
        max2 = fabs(p0_4_p1_4);
    } 
    if( (max2 < fabs(p0_5_p1_5)) )
    {
        max2 = fabs(p0_5_p1_5);
    } 
    if( (max2 < fabs(p0_6_p1_6)) )
    {
        max2 = fabs(p0_6_p1_6);
    } 
    if( (max2 < fabs(q0_0_p0_0)) )
    {
        max2 = fabs(q0_0_p0_0);
    } 
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (lower_bound_1 < 1.27080861580266953580e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 5.59936185544450928309e+101) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.37779349582504943796e-14 * (max1 * max2));
        if( (r > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}